

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_ExcludesFlags_Test::TestBody(TApp_ExcludesFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *opt;
  Option *this_01;
  long lVar3;
  AssertHelper AStack_f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-s,--string","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  opt = CLI::App::add_flag(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--nostr","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  this_01 = CLI::App::add_flag(this_00,&local_90,&local_b0);
  CLI::Option::excludes(this_01,opt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_f0[0].ptr_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"-s","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_f0,
             local_d0);
  if (local_f0[0].ptr_ != local_e0) {
    operator_delete(local_f0[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_f0[0].ptr_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"--nostr","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_f0,
             local_d0);
  if (local_f0[0].ptr_ != local_e0) {
    operator_delete(local_f0[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_f0[0].ptr_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"--nostr","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"-s","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_f0,
             &local_b0);
  lVar3 = 0;
  do {
    if (local_c0 + lVar3 != *(undefined1 **)((long)local_d0 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_d0 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3fc,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_f0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
  if (local_f0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_f0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_f0[0].ptr_ + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_f0[0].ptr_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"--string","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"--nostr","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_f0,
             &local_b0);
  lVar3 = 0;
  do {
    if (local_c0 + lVar3 != *(undefined1 **)((long)local_d0 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_d0 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x400,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_f0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
  if (local_f0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_f0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_f0[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(TApp, ExcludesFlags) {
    CLI::Option *opt = app.add_flag("-s,--string");
    app.add_flag("--nostr")->excludes(opt);

    run();

    app.reset();
    args = {"-s"};
    run();

    app.reset();
    args = {"--nostr"};
    run();

    app.reset();
    args = {"--nostr", "-s"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--string", "--nostr"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}